

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::internal::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bigint *divisor;
  int iVar5;
  int *in_RSI;
  buffer<char> *in_RDI;
  int result;
  bool high;
  bool low;
  int digit;
  char *data;
  int num_digits;
  bool even;
  uint64_t significand;
  int shift;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcf4;
  undefined2 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfa;
  byte in_stack_fffffffffffffcfb;
  undefined4 in_stack_fffffffffffffcfc;
  bigint *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int iVar7;
  undefined4 in_stack_fffffffffffffd0c;
  uint uVar8;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  bigint *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined1 *local_2d0;
  undefined1 local_2c8 [168];
  undefined1 local_220 [520];
  int *local_18;
  buffer<char> *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bigint::bigint(in_stack_fffffffffffffd00);
  bigint::bigint(in_stack_fffffffffffffd00);
  bigint::bigint(in_stack_fffffffffffffd00);
  bigint::bigint(in_stack_fffffffffffffd00);
  local_2d0 = (undefined1 *)0x0;
  fp::fp((fp *)&stack0xfffffffffffffd20);
  bVar1 = fp::assign<double,_0>
                    ((fp *)in_stack_fffffffffffffd20,
                     (double)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcf0);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = 2;
  }
  if (in_stack_fffffffffffffd28 < 0) {
    if (*local_18 < 0) {
      bigint::assign_pow10
                ((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcdc);
      bigint::assign(in_stack_fffffffffffffd00,
                     (bigint *)
                     CONCAT44(in_stack_fffffffffffffcfc,
                              CONCAT13(in_stack_fffffffffffffcfb,
                                       CONCAT12(in_stack_fffffffffffffcfa,in_stack_fffffffffffffcf8)
                                      )));
      if (iVar2 != 1) {
        bigint::assign(in_stack_fffffffffffffd00,
                       (bigint *)
                       CONCAT44(in_stack_fffffffffffffcfc,
                                CONCAT13(in_stack_fffffffffffffcfb,
                                         CONCAT12(in_stack_fffffffffffffcfa,
                                                  in_stack_fffffffffffffcf8))));
        bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
        local_2d0 = local_2c8;
      }
      iVar7 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          iVar7);
    }
    else {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      iVar7 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
      bigint::assign_pow10
                ((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcdc);
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          iVar7);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      if (iVar2 != 1) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        local_2d0 = local_2c8;
      }
    }
  }
  else {
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    iVar7 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        iVar7);
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        iVar7);
    if (iVar2 != 1) {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6),
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          iVar7);
      local_2d0 = local_2c8;
    }
    bigint::assign_pow10
              ((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcdc);
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        iVar7);
  }
  if (local_2d0 == (undefined1 *)0x0) {
    local_2d0 = local_220;
  }
  uVar8 = CONCAT13(((ulong)in_stack_fffffffffffffd20 & 1) == 0,(int3)in_stack_fffffffffffffd0c);
  iVar7 = 0;
  divisor = (bigint *)buffer<char>::data(local_10);
  while( true ) {
    iVar3 = bigint::divmod_assign((bigint *)CONCAT44(uVar8,iVar7),divisor);
    iVar4 = compare((bigint *)
                    CONCAT44(iVar3,CONCAT13(in_stack_fffffffffffffcfb,
                                            CONCAT12(in_stack_fffffffffffffcfa,
                                                     in_stack_fffffffffffffcf8))),
                    (bigint *)CONCAT44(in_stack_fffffffffffffcf4,uVar6));
    in_stack_fffffffffffffcfb = (byte)(iVar4 - (uVar8 >> 0x18 & 1) >> 0x1f);
    iVar4 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                        in_stack_fffffffffffffd20,
                        (bigint *)CONCAT44(iVar2,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffcfa = 0 < (int)(iVar4 + (uint)((byte)(uVar8 >> 0x18) & 1));
    iVar5 = iVar7 + 1;
    *(char *)((long)(divisor->bigits_).store_ + (long)iVar7 + -0x20) = (char)iVar3 + '0';
    if (((in_stack_fffffffffffffcfb & 1) != 0) || ((bool)in_stack_fffffffffffffcfa)) break;
    bigint::operator*=((bigint *)CONCAT44(iVar4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc
                      );
    bigint::operator*=((bigint *)CONCAT44(iVar4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc
                      );
    iVar7 = iVar5;
    if (local_2d0 != local_220) {
      bigint::operator*=((bigint *)CONCAT44(iVar4,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcdc);
      iVar7 = iVar5;
    }
  }
  if ((in_stack_fffffffffffffcfb & 1) == 0) {
    *(char *)((long)(divisor->bigits_).store_ + (long)iVar7 + -0x20) =
         *(char *)((long)(divisor->bigits_).store_ + (long)iVar7 + -0x20) + '\x01';
  }
  else if (((bool)in_stack_fffffffffffffcfa) &&
          ((in_stack_fffffffffffffce0 =
                 add_compare((bigint *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                             ,in_stack_fffffffffffffd20,
                             (bigint *)CONCAT44(iVar2,in_stack_fffffffffffffd18)),
           0 < in_stack_fffffffffffffce0 || ((in_stack_fffffffffffffce0 == 0 && (iVar3 % 2 != 0)))))
          ) {
    *(char *)((long)(divisor->bigits_).store_ + (long)(iVar5 + -1) + -0x20) =
         *(char *)((long)(divisor->bigits_).store_ + (long)(iVar5 + -1) + -0x20) + '\x01';
  }
  buffer<char>::resize
            ((buffer<char> *)CONCAT44(iVar4,in_stack_fffffffffffffce0),
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  *local_18 = *local_18 - (iVar5 + -1);
  bigint::~bigint((bigint *)0x21f720);
  bigint::~bigint((bigint *)0x21f72d);
  bigint::~bigint((bigint *)0x21f73a);
  bigint::~bigint((bigint *)0x21f747);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(num_digits);
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}